

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QPalette * __thiscall
QApplicationPrivate::applyQIconStyleHelper(QApplicationPrivate *this,Mode mode,QPixmap *base)

{
  QStyle *pQVar1;
  QStyleOption *in_RCX;
  undefined4 in_EDX;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QStyleOption opt;
  QPalette *other;
  QStyleOption *this_00;
  undefined1 **ppuVar2;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QPalettePrivate *pQStack_30;
  undefined1 *local_28;
  QObject *pQStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  ppuVar2 = &local_48;
  other = in_RDI;
  QStyleOption::QStyleOption(in_RCX,(int)((ulong)ppuVar2 >> 0x20),(int)ppuVar2);
  this_00 = (QStyleOption *)local_58;
  QGuiApplication::palette();
  QPalette::operator=((QPalette *)this_00,other);
  QPalette::~QPalette((QPalette *)this_00);
  pQVar1 = QApplication::style();
  (**(code **)(*(long *)pQVar1 + 0x108))(in_RDI,pQVar1,in_EDX,in_RCX,ppuVar2);
  QStyleOption::~QStyleOption(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return other;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QApplicationPrivate::applyQIconStyleHelper(QIcon::Mode mode, const QPixmap& base) const
{
    QStyleOption opt(0);
    opt.palette = QGuiApplication::palette();
    return QApplication::style()->generatedIconPixmap(mode, base, &opt);
}